

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void send_additional_header(mg_connection *conn)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcStack_440;
  mg_header amStack_438 [64];
  
  pcVar3 = conn->dom_ctx->config[0x38];
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    pcVar3 = mg_strdup_ctx(pcVar3,(mg_context *)pcVar3);
    if (pcVar3 != (char *)0x0) {
      pcStack_440 = pcVar3;
      uVar1 = parse_http_headers(&pcStack_440,amStack_438);
      uVar4 = 0;
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar5 = uVar4;
      }
      for (; uVar5 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
        uVar2 = mg_response_header_add
                          (conn,*(char **)((long)&amStack_438[0].name + uVar4),
                           *(char **)((long)&amStack_438[0].value + uVar4),-1);
        if (-1 < (int)uVar2) {
          uVar2 = uVar1;
        }
        if (0 < (int)uVar1) {
          uVar1 = uVar2;
        }
      }
      free(pcVar3);
    }
    return;
  }
  return;
}

Assistant:

static void
send_additional_header(struct mg_connection *conn)
{
	const char *header = conn->dom_ctx->config[ADDITIONAL_HEADER];

#if !defined(NO_SSL)
	if (conn->dom_ctx->config[STRICT_HTTPS_MAX_AGE]) {
		long max_age = atol(conn->dom_ctx->config[STRICT_HTTPS_MAX_AGE]);
		if (max_age >= 0) {
			char val[64];
			mg_snprintf(conn,
			            NULL,
			            val,
			            sizeof(val),
			            "max-age=%lu",
			            (unsigned long)max_age);
			mg_response_header_add(conn, "Strict-Transport-Security", val, -1);
		}
	}
#endif

	if (header && header[0]) {
		mg_response_header_add_lines(conn, header);
	}
}